

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GatherLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_gather(NeuralNetworkLayer *this)

{
  ulong uVar1;
  GatherLayerParams *pGVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x3a2) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3a2;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pGVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::GatherLayerParams>
                       (arena);
    (this->layer_).gather_ = pGVar2;
  }
  return (GatherLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherLayerParams* NeuralNetworkLayer::_internal_mutable_gather() {
  if (!_internal_has_gather()) {
    clear_layer();
    set_has_gather();
    layer_.gather_ = CreateMaybeMessage< ::CoreML::Specification::GatherLayerParams >(GetArenaForAllocation());
  }
  return layer_.gather_;
}